

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

ssize_t zip_get_local_file_header_size(archive_read *a,size_t extra)

{
  uint16_t uVar1;
  uint16_t uVar2;
  void *pvVar3;
  int *piVar4;
  ssize_t extra_length;
  ssize_t filename_length;
  char *p;
  size_t extra_local;
  archive_read *a_local;
  
  pvVar3 = __archive_read_ahead(a,extra + 0x1e,(ssize_t *)0x0);
  if (pvVar3 == (void *)0x0) {
    archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
    a_local = (archive_read *)0xffffffffffffffec;
  }
  else {
    piVar4 = (int *)(extra + (long)pvVar3);
    if (*piVar4 == 0x4034b50) {
      uVar1 = archive_le16dec((void *)((long)piVar4 + 0x1a));
      uVar2 = archive_le16dec(piVar4 + 7);
      a_local = (archive_read *)((ulong)uVar1 + 0x1e + (ulong)uVar2);
    }
    else {
      archive_set_error(&a->archive,-1,"Damaged Zip archive");
      a_local = (archive_read *)0xffffffffffffffec;
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
zip_get_local_file_header_size(struct archive_read *a, size_t extra)
{
	const char *p;
	ssize_t filename_length, extra_length;

	if ((p = __archive_read_ahead(a, extra + 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_WARN);
	}
	p += extra;

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_WARN;
	}
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	return (30 + filename_length + extra_length);
}